

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O0

nanoseconds __thiscall anon_unknown.dwarf_f6f6::MovieState::getMasterClock(MovieState *this)

{
  long in_RDI;
  VideoState *in_stack_00000048;
  undefined8 local_8;
  
  if (*(int *)(in_RDI + 0x10) == 1) {
    local_8 = VideoState::getClock(in_stack_00000048);
  }
  else if (*(int *)(in_RDI + 0x10) == 0) {
    local_8 = AudioState::getClock((AudioState *)this);
  }
  else {
    local_8 = getClock(this);
  }
  return (nanoseconds)local_8;
}

Assistant:

nanoseconds MovieState::getMasterClock()
{
    if(mAVSyncType == SyncMaster::Video)
        return mVideo.getClock();
    if(mAVSyncType == SyncMaster::Audio)
        return mAudio.getClock();
    return getClock();
}